

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O2

void sbfPub_sendBuffer(sbfPub pub,sbfBuffer buffer)

{
  ulong size;
  sbfTportStream tstream;
  size_t hdrSize;
  sbfLog psVar1;
  char *pcVar2;
  undefined2 *data;
  
  if ((buffer->mRefCount).mRefCount == 1) {
    size = buffer->mSize;
    if (size < 0x10001) {
      if ((pub->mDestroyed == 0) && (pub->mReady != 0)) {
        tstream = pub->mTportStream;
        hdrSize = pub->mHeaderSize;
        if ((ulong)pub->mTport->mHandlerTable->mPacketSize < hdrSize + size) {
          sbfTport_fragment(tstream,buffer,pub->mHeader,hdrSize);
        }
        else if ((sbfPub)buffer->mOwner == pub) {
          data = (undefined2 *)((long)buffer->mData - hdrSize);
          *data = (short)size;
          *(undefined1 *)(data + 2) = 1;
          sbfBuffer_setData(buffer,data);
          sbfBuffer_setSize(buffer,hdrSize + size);
          pthread_mutex_lock((pthread_mutex_t *)&tstream->mSendLock);
          (*tstream->mTport->mHandlerTable->mSendBuffer)(tstream->mStream,buffer);
          pthread_mutex_unlock((pthread_mutex_t *)&tstream->mSendLock);
        }
        else {
          sbfPub_send(pub,buffer->mData,size);
        }
      }
    }
    else {
      psVar1 = pub->mTport->mLog;
      pcVar2 = sbfTopic_getTopic(pub->mTopic);
      sbfLog_log(psVar1,3,"message size %zu too big on publisher %p (%s)",size,pub,pcVar2);
    }
    sbfBuffer_destroy(buffer);
    return;
  }
  __assert_fail("((&buffer->mRefCount)->mRefCount) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfPub.c"
                ,0x166,"void sbfPub_sendBuffer(sbfPub, sbfBuffer)");
}

Assistant:

void
sbfPub_sendBuffer (sbfPub pub, sbfBuffer buffer)
{
    sbfTport       tport = pub->mTport;
    sbfTportStream tstream = pub->mTportStream;
    sbfTportHeader hdr;
    size_t         size;

    SBF_ASSERT (sbfRefCount_get (&buffer->mRefCount) == 1);

    if (!sbfTport_checkMessageSize (pub, sbfBuffer_getSize (buffer)))
    {
        sbfBuffer_destroy (buffer);
        return;
    }
    if (SBF_UNLIKELY (pub->mDestroyed || !pub->mReady))
    {
        sbfBuffer_destroy (buffer);
        return;
    }

    size = sbfBuffer_getSize (buffer) + pub->mHeaderSize;
    if (SBF_UNLIKELY (size > tport->mHandlerTable->mPacketSize))
    {
        sbfTport_fragment (tstream, buffer, pub->mHeader, pub->mHeaderSize);
        sbfBuffer_destroy (buffer);
        return;
    }

    if (SBF_UNLIKELY (buffer->mOwner != pub))
    {
        sbfPub_send (pub,
                     sbfBuffer_getData (buffer),
                     sbfBuffer_getSize (buffer));
        sbfBuffer_destroy (buffer);
        return;
    }

    hdr = (void*)((char*)sbfBuffer_getData (buffer) - pub->mHeaderSize);
    hdr->mSize = sbfBuffer_getSize (buffer);
    hdr->mFlags = SBF_MESSAGE_FLAG_LAST_IN_PACKET;

    sbfBuffer_setData (buffer, hdr);
    sbfBuffer_setSize (buffer, size);

    sbfTport_sendBuffer (tstream, buffer);
    sbfBuffer_destroy (buffer);
}